

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

void __thiscall QUnifiedTimer::startAnimationDriver(QUnifiedTimer *this)

{
  qint64 qVar1;
  
  if (*(char *)(*(long *)(*(long *)(this + 0x10) + 8) + 0x88) != '\x01') {
    qVar1 = elapsed(this);
    *(qint64 *)(this + 0xc0) = qVar1;
    (**(code **)(**(long **)(this + 0x10) + 0x70))();
    return;
  }
  startAnimationDriver();
  return;
}

Assistant:

void QUnifiedTimer::startAnimationDriver()
{
    if (driver->isRunning()) {
        qWarning("QUnifiedTimer::startAnimationDriver: driver is already running...");
        return;
    }
    // Set the start time to the currently elapsed() value before starting.
    // This means we get the animation system time including the temporal drift
    // which is what we want.
    driverStartTime = elapsed();
    driver->start();
}